

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guiddatabase.cpp
# Opt level: O3

USTATUS guidDatabaseExportToFile(CBString *outPath,GuidDatabase *db)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  USTATUS UVar3;
  _Rb_tree_header *p_Var4;
  _Self __tmp;
  string name;
  string guid;
  ofstream outputFile;
  allocator local_271;
  CBString local_270;
  char *local_250;
  long local_248;
  char local_240 [16];
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(char *)(outPath->super_tagbstring).data,_S_trunc|_S_out);
  UVar3 = 5;
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    p_Var2 = (db->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(db->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var4) {
      do {
        guidToUString(&local_270,(EFI_GUID *)(p_Var2 + 1),false);
        std::__cxx11::string::string
                  ((string *)&local_250,(char *)local_270.super_tagbstring.data,&local_271);
        Bstrlib::CBString::~CBString(&local_270);
        std::__cxx11::string::string((string *)&local_270,*(char **)(p_Var2 + 2),&local_271);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_250,local_248);
        local_271 = (allocator)0x2c;
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_271,1);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,(char *)local_270._vptr_CBString,local_270.super_tagbstring._0_8_
                           );
        local_271 = (allocator)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_271,1);
        if (local_270._vptr_CBString != (_func_int **)&local_270.super_tagbstring.data) {
          operator_delete(local_270._vptr_CBString);
        }
        if (local_250 != local_240) {
          operator_delete(local_250);
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var4);
    }
    UVar3 = 0;
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return UVar3;
}

Assistant:

USTATUS guidDatabaseExportToFile(const UString & outPath, GuidDatabase & db)
{
    std::ofstream outputFile(outPath.toLocal8Bit(), std::ios::out | std::ios::trunc);
    if (!outputFile)
        return U_FILE_OPEN;
    for (GuidDatabase::iterator it = db.begin(); it != db.end(); it++) {
        std::string guid(guidToUString (it->first, false).toLocal8Bit());
        std::string name(it->second.toLocal8Bit());
        outputFile << guid << ',' << name << '\n';
    }
    
    return U_SUCCESS;
}